

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O3

void __thiscall
de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage
          (ArrayBuffer<unsigned_char,_1UL,_1UL> *this,size_t numElements)

{
  void *ptr;
  size_t sVar1;
  ArrayBuffer<unsigned_char,_1UL,_1UL> local_20;
  
  ArrayBuffer(&local_20,numElements);
  ptr = this->m_ptr;
  sVar1 = this->m_cap;
  this->m_ptr = local_20.m_ptr;
  this->m_cap = local_20.m_cap;
  local_20.m_ptr = ptr;
  local_20.m_cap = sVar1;
  detail::ArrayBuffer_AlignedFree(ptr);
  return;
}

Assistant:

void ArrayBuffer<T,Alignment,Stride>::setStorage (size_t numElements)
{
	// create new buffer of the wanted size, swap to it
	ArrayBuffer<T,Alignment,Stride> newBuffer(numElements);
	swap(newBuffer);
}